

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void disas_crypto_aes(DisasContext_conflict1 *s,uint32_t insn)

{
  wchar_t val;
  TCGContext_conflict1 *s_00;
  code *pcVar1;
  TCGContext_conflict1 *s_01;
  uint uVar2;
  ulong uVar3;
  TCGTemp *ts;
  TCGTemp *pTVar4;
  TCGv_i32 pTVar5;
  TCGContext_conflict1 *tcg_ctx;
  TCGContext_conflict1 *tcg_ctx_1;
  uintptr_t o_1;
  uintptr_t o;
  TCGv_i64 ret;
  
  if ((((insn & 0xc00000) != 0) || ((s->isar->id_aa64isar0 & 0xf0) == 0)) ||
     (uVar2 = (insn >> 0xc & 0x1f) - 4, 3 < (ushort)uVar2)) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s_00 = s->uc->tcg_ctx;
  uVar3 = (ulong)(uVar2 & 0xffff);
  val = L"CEGIDFHI"[uVar3 + 8];
  pcVar1 = (code *)(&PTR_gen_helper_crypto_aese_01067310)[uVar3];
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  tcg_gen_addi_i64_aarch64
            (s_00,(TCGv_i64)((long)ts - (long)s_00),(TCGv_i64)s_00->cpu_env,
             (ulong)((insn & 0x1f) * 0x100 + 0xc10));
  s_01 = s->uc->tcg_ctx;
  pTVar4 = tcg_temp_new_internal_aarch64(s_01,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar4 - (long)s_01);
  tcg_gen_addi_i64_aarch64(s_01,ret,(TCGv_i64)s_01->cpu_env,(ulong)((insn & 0x3e0) * 8 + 0xc10));
  pTVar5 = tcg_const_i32_aarch64(s_00,val);
  (*pcVar1)(s_00,(TCGv_i64)((long)ts - (long)s_00),ret,pTVar5);
  tcg_temp_free_internal_aarch64(s_00,ts);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar5 + (long)s_00));
  return;
}

Assistant:

static void disas_crypto_aes(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int size = extract32(insn, 22, 2);
    int opcode = extract32(insn, 12, 5);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    int decrypt;
    TCGv_ptr tcg_rd_ptr, tcg_rn_ptr;
    TCGv_i32 tcg_decrypt;
    CryptoThreeOpIntFn *genfn;

    if (!dc_isar_feature(aa64_aes, s) || size != 0) {
        unallocated_encoding(s);
        return;
    }

    switch (opcode) {
    case 0x4: /* AESE */
        decrypt = 0;
        genfn = gen_helper_crypto_aese;
        break;
    case 0x6: /* AESMC */
        decrypt = 0;
        genfn = gen_helper_crypto_aesmc;
        break;
    case 0x5: /* AESD */
        decrypt = 1;
        genfn = gen_helper_crypto_aese;
        break;
    case 0x7: /* AESIMC */
        decrypt = 1;
        genfn = gen_helper_crypto_aesmc;
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    tcg_rd_ptr = vec_full_reg_ptr(s, rd);
    tcg_rn_ptr = vec_full_reg_ptr(s, rn);
    tcg_decrypt = tcg_const_i32(tcg_ctx, decrypt);

    genfn(tcg_ctx, tcg_rd_ptr, tcg_rn_ptr, tcg_decrypt);

    tcg_temp_free_ptr(tcg_ctx, tcg_rd_ptr);
    tcg_temp_free_ptr(tcg_ctx, tcg_rn_ptr);
    tcg_temp_free_i32(tcg_ctx, tcg_decrypt);
}